

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

int xcb_input_hierarchy_change_data_serialize
              (void **_buffer,uint16_t type,xcb_input_hierarchy_change_data_t *_aux)

{
  uint uVar1;
  ushort *in_RDX;
  short in_SI;
  long *in_RDI;
  long in_FS_OFFSET;
  char *xcb_tmp;
  uint i;
  uint xcb_block_len;
  uint xcb_parts_idx;
  uint xcb_padding_offset;
  uint xcb_align_to;
  uint xcb_buffer_len;
  char *xcb_out;
  uint xcb_pad;
  char xcb_pad0 [3];
  iovec xcb_parts [16];
  void *local_150;
  uint local_148;
  int local_144;
  uint local_140;
  int local_138;
  int local_134;
  void *local_130;
  uint local_110;
  undefined1 local_10b [3];
  ulong local_108 [2];
  ushort *puStack_f8;
  ulong auStack_f0 [5];
  undefined1 *puStack_c8;
  ulong auStack_c0 [23];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_130 = (void *)*in_RDI;
  local_134 = 0;
  local_138 = 0;
  local_110 = 0;
  memset(local_10b,0,3);
  memset(local_108,0xaa,0x100);
  local_140 = 0;
  if (in_SI == 1) {
    local_108[1] = 2;
    puStack_f8 = in_RDX + 1;
    auStack_f0[0] = 1;
    auStack_f0[1] = (long)in_RDX + 3;
    auStack_f0[2] = 1;
    auStack_f0[3] = *(undefined8 *)(in_RDX + 4);
    auStack_f0[4] = (ulong)*in_RDX;
    local_140 = 4;
    local_138 = 4;
    uVar1 = -(uint)*in_RDX & 3;
    local_134 = *in_RDX + uVar1 + 4;
    if (uVar1 != 0) {
      puStack_c8 = local_10b;
      auStack_c0[0] = (ulong)uVar1;
      local_140 = 5;
    }
  }
  local_144 = 0;
  if (in_SI == 2) {
    local_108[(ulong)local_140 * 2] = (ulong)(in_RDX + 8);
    local_108[(ulong)local_140 * 2 + 1] = 2;
    local_108[(ulong)(local_140 + 1) * 2] = (ulong)(in_RDX + 9);
    local_108[(ulong)(local_140 + 1) * 2 + 1] = 1;
    local_108[(ulong)(local_140 + 2) * 2] = (ulong)&local_110;
    local_108[(ulong)(local_140 + 2) * 2 + 1] = 1;
    local_108[(ulong)(local_140 + 3) * 2] = (ulong)(in_RDX + 10);
    local_108[(ulong)(local_140 + 3) * 2 + 1] = 2;
    local_108[(ulong)(local_140 + 4) * 2] = (ulong)(in_RDX + 0xb);
    local_144 = 8;
    local_108[(ulong)(local_140 + 4) * 2 + 1] = 2;
    local_140 = local_140 + 5;
    local_138 = 2;
  }
  if (in_SI == 3) {
    local_108[(ulong)local_140 * 2] = (ulong)(in_RDX + 0xc);
    local_108[(ulong)local_140 * 2 + 1] = 2;
    local_108[(ulong)(local_140 + 1) * 2] = (ulong)(in_RDX + 0xd);
    local_144 = local_144 + 4;
    local_108[(ulong)(local_140 + 1) * 2 + 1] = 2;
    local_140 = local_140 + 2;
    local_138 = 2;
  }
  if (in_SI == 4) {
    local_108[(ulong)local_140 * 2] = (ulong)(in_RDX + 0xe);
    local_108[(ulong)local_140 * 2 + 1] = 2;
    local_108[(ulong)(local_140 + 1) * 2] = (ulong)local_10b;
    local_144 = local_144 + 4;
    local_108[(ulong)(local_140 + 1) * 2 + 1] = 2;
    local_140 = local_140 + 2;
    local_138 = 1;
  }
  local_110 = -local_144 & local_138 - 1U;
  uVar1 = local_144 + local_110 + local_134;
  if (local_110 != 0) {
    local_108[(ulong)local_140 * 2] = (ulong)local_10b;
    local_108[(ulong)local_140 * 2 + 1] = (ulong)local_110;
    local_140 = local_140 + 1;
    local_110 = 0;
  }
  if (local_130 == (void *)0x0) {
    local_130 = malloc((ulong)uVar1);
    *in_RDI = (long)local_130;
  }
  local_150 = local_130;
  for (local_148 = 0; local_148 < local_140; local_148 = local_148 + 1) {
    if ((local_108[(ulong)local_148 * 2] != 0) && (local_108[(ulong)local_148 * 2 + 1] != 0)) {
      memcpy(local_150,(void *)local_108[(ulong)local_148 * 2],local_108[(ulong)local_148 * 2 + 1]);
    }
    if (local_108[(ulong)local_148 * 2 + 1] != 0) {
      local_150 = (void *)(local_108[(ulong)local_148 * 2 + 1] + (long)local_150);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

int
xcb_input_hierarchy_change_data_serialize (void                                    **_buffer,
                                           uint16_t                                  type,
                                           const xcb_input_hierarchy_change_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[16];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_ADD_MASTER) {
        /* xcb_input_hierarchy_change_data_t.add_master.name_len */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.name_len;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_hierarchy_change_data_t.add_master.send_core */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.send_core;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.add_master.enable */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.enable;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* name */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->add_master.name;
        xcb_block_len += _aux->add_master.name_len * sizeof(char);
        xcb_parts[xcb_parts_idx].iov_len = _aux->add_master.name_len * sizeof(char);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(char);
        xcb_align_to = 4;
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_REMOVE_MASTER) {
        /* xcb_input_hierarchy_change_data_t.remove_master.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_pointer */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_pointer;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_keyboard */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_keyboard;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_ATTACH_SLAVE) {
        /* xcb_input_hierarchy_change_data_t.attach_slave.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->attach_slave.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.attach_slave.master */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->attach_slave.master;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_DETACH_SLAVE) {
        /* xcb_input_hierarchy_change_data_t.detach_slave.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->detach_slave.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.detach_slave.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}